

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall
cmState::AddBuiltinCommand
          (cmState *this,string *name,
          unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *command)

{
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> local_50;
  cmLegacyCommandWrapper local_48;
  Command local_40;
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *local_20;
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *command_local;
  string *name_local;
  cmState *this_local;
  
  local_20 = command;
  command_local = (unique_ptr<cmCommand,_std::default_delete<cmCommand>_> *)name;
  name_local = (string *)this;
  std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::unique_ptr(&local_50,command);
  cmLegacyCommandWrapper::cmLegacyCommandWrapper(&local_48,&local_50);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<cmLegacyCommandWrapper,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_40,&local_48);
  AddBuiltinCommand(this,name,&local_40);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_40);
  cmLegacyCommandWrapper::~cmLegacyCommandWrapper(&local_48);
  std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::~unique_ptr(&local_50);
  return;
}

Assistant:

void cmState::AddBuiltinCommand(std::string const& name,
                                std::unique_ptr<cmCommand> command)
{
  this->AddBuiltinCommand(name, cmLegacyCommandWrapper(std::move(command)));
}